

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_seq.c
# Opt level: O0

int mk_phone_seq(acmod_id_t **out_phone,uint32 *out_n_phone,char *trans,acmod_set_t *acmod_set,
                lexicon_t *lex)

{
  char *pcVar1;
  char *local_50;
  char *btw_mark;
  acmod_id_t *phone;
  uint32 n_phone;
  uint32 n_word;
  char **word;
  lexicon_t *lex_local;
  acmod_set_t *acmod_set_local;
  char *trans_local;
  uint32 *out_n_phone_local;
  acmod_id_t **out_phone_local;
  
  word = (char **)lex;
  lex_local = (lexicon_t *)acmod_set;
  acmod_set_local = (acmod_set_t *)trans;
  trans_local = (char *)out_n_phone;
  out_n_phone_local = (uint32 *)out_phone;
  phone._4_4_ = str2words(trans,(char **)0x0,0);
  _n_phone = (char **)__ckd_calloc__((ulong)phone._4_4_,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_seq.c"
                                     ,0x48);
  str2words((char *)acmod_set_local,_n_phone,phone._4_4_);
  btw_mark = (char *)mk_phone_list(&local_50,(uint32 *)&phone,_n_phone,phone._4_4_,(lexicon_t *)word
                                  );
  if ((acmod_id_t *)btw_mark == (acmod_id_t *)0x0) {
    pcVar1 = corpus_utt();
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_seq.c"
            ,0x4c,"Unable to produce phonetic transcription for the utterance \'%s\'.\n",pcVar1);
  }
  cvt2triphone((acmod_set_t *)lex_local,(acmod_id_t *)btw_mark,local_50,(uint32)phone);
  ckd_free(local_50);
  ckd_free(_n_phone);
  *(char **)out_n_phone_local = btw_mark;
  *(uint32 *)trans_local = (uint32)phone;
  return 0;
}

Assistant:

int
mk_phone_seq(acmod_id_t **out_phone,
	     uint32 *out_n_phone,
	     char *trans,
	     acmod_set_t *acmod_set,
	     lexicon_t *lex)
{
    char **word;
    uint32 n_word;
    uint32 n_phone;
    acmod_id_t *phone;
    char *btw_mark;


    n_word = str2words(trans, NULL, 0);
    word = ckd_calloc(n_word, sizeof(char*));
    str2words(trans, word, n_word);
    phone = mk_phone_list(&btw_mark, &n_phone, word, n_word, lex);
    if (phone == NULL) {
	E_WARN("Unable to produce phonetic transcription for the utterance '%s'.\n", corpus_utt());
    }

    cvt2triphone(acmod_set, phone, btw_mark, n_phone);

    ckd_free(btw_mark);
    ckd_free(word);

    *out_phone = phone;
    *out_n_phone = n_phone;

    return S3_SUCCESS;
}